

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

void Gia_ManCountCareBits(Gia_Man_t *p,Vec_Wec_t *vPats)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  
  iVar11 = 0;
  uVar10 = 0;
LAB_0048b612:
  uVar4 = vPats->nSize;
  if ((int)uVar4 <= iVar11) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)uVar4;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar10;
    iVar11 = Gia_ManAndNum(p);
    printf("Stats over %d patterns: Average care-nodes = %d (%6.2f %%)\n",
           ((double)SUB164(auVar3 / auVar2,0) * 100.0) / (double)iVar11,(ulong)uVar4,
           SUB168(auVar3 / auVar2,0) & 0xffffffff);
    return;
  }
  p_00 = Vec_WecEntry(vPats,iVar11);
  if (p_00->nSize != p->vCis->nSize) {
    __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x364,"void Gia_ManCountCareBits(Gia_Man_t *, Vec_Wec_t *)");
  }
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffffffffff;
  iVar13 = 0;
  while ((iVar13 < p->vCis->nSize && (pGVar6 = Gia_ManCi(p,iVar13), pGVar6 != (Gia_Obj_t *)0x0))) {
    uVar4 = Vec_IntEntry(p_00,iVar13);
    *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xbfffffffbfffffff | (ulong)((uVar4 & 1) << 0x1e);
    iVar13 = iVar13 + 1;
  }
  iVar13 = 0;
  while ((iVar13 < p->nObjs && (pGVar6 = Gia_ManObj(p,iVar13), pGVar6 != (Gia_Obj_t *)0x0))) {
    uVar8 = *(ulong *)pGVar6;
    if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
      uVar4 = (uint)(uVar8 >> 0x20);
      *(ulong *)pGVar6 =
           uVar8 & 0xbfffffff3fffffff |
           (ulong)(((uVar4 >> 0x1d ^ *(uint *)(pGVar6 + -(ulong)(uVar4 & 0x1fffffff)) >> 0x1e) &
                    ((uint)(uVar8 >> 0x1d) & 7 ^ *(uint *)(pGVar6 + -(uVar8 & 0x1fffffff)) >> 0x1e)
                   & 1) << 0x1e);
    }
    iVar13 = iVar13 + 1;
  }
  iVar13 = 0;
  while ((iVar13 < p->vCos->nSize && (pGVar6 = Gia_ManCo(p,iVar13), pGVar6 != (Gia_Obj_t *)0x0))) {
    uVar4 = (uint)*(ulong *)pGVar6;
    uVar8 = (ulong)(uVar4 & 0x1fffffff);
    *(ulong *)pGVar6 =
         *(ulong *)pGVar6 & 0xffffffffbfffffff |
         (ulong)((uVar4 * 2 ^ *(uint *)(pGVar6 + -uVar8)) & 0x40000000);
    *(ulong *)(pGVar6 + -uVar8) = *(ulong *)(pGVar6 + -uVar8) | 0x4000000000000000;
    iVar13 = iVar13 + 1;
  }
  iVar13 = p->nObjs;
LAB_0048b793:
  do {
    if (iVar13 < 2) break;
    iVar13 = iVar13 + -1;
    pGVar6 = Gia_ManObj(p,iVar13);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar8 = *(ulong *)pGVar6;
    uVar7 = uVar8 & 0x1fffffff;
    if ((uVar8 & 0x4000000080000000) == 0x4000000000000000 && uVar7 != 0x1fffffff) {
      uVar1 = *(ulong *)(pGVar6 + -uVar7);
      if (((uint)uVar8 >> 0x1e & 1) == 0) {
        uVar12 = (uint)(uVar1 >> 0x1e) & 1;
        uVar5 = (uint)(uVar8 >> 0x1d) & 7;
        uVar4 = (uint)(uVar8 >> 0x20);
        uVar8 = (ulong)(uVar4 & 0x1fffffff);
        uVar4 = uVar4 >> 0x1d ^ (uint)(*(ulong *)(pGVar6 + -uVar8) >> 0x1e) & 3;
        if ((uVar12 != uVar5) && ((uVar4 & 1) != 0)) {
          __assert_fail("fCompl0 == 0 || fCompl1 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                        ,899,"void Gia_ManCountCareBits(Gia_Man_t *, Vec_Wec_t *)");
        }
        pGVar9 = pGVar6 + -uVar8;
        uVar8 = *(ulong *)(pGVar6 + -uVar8);
        if (((uVar4 & 1) != 0) && (pGVar9 = pGVar6 + -uVar7, uVar8 = uVar1, uVar12 != uVar5))
        goto LAB_0048b793;
      }
      else {
        *(ulong *)(pGVar6 + -uVar7) = uVar1 | 0x4000000000000000;
        uVar8 = (ulong)(*(uint *)&pGVar6->field_0x4 & 0x1fffffff);
        pGVar9 = pGVar6 + -uVar8;
        uVar8 = *(ulong *)(pGVar6 + -uVar8);
      }
      *(ulong *)pGVar9 = uVar8 | 0x4000000000000000;
    }
  } while( true );
  iVar13 = 0;
  uVar4 = 0;
  while ((iVar13 < p->nObjs && (pGVar6 = Gia_ManObj(p,iVar13), pGVar6 != (Gia_Obj_t *)0x0))) {
    uVar5 = (uint)*(undefined8 *)pGVar6;
    uVar12 = (uint)((ulong)*(undefined8 *)pGVar6 >> 0x3e) & 1;
    if ((~uVar5 & 0x1fffffff) == 0) {
      uVar12 = 0;
    }
    if ((int)uVar5 < 0) {
      uVar12 = 0;
    }
    uVar4 = uVar12 + uVar4;
    iVar13 = iVar13 + 1;
  }
  uVar10 = uVar10 + uVar4;
  iVar11 = iVar11 + 1;
  goto LAB_0048b612;
}

Assistant:

void Gia_ManCountCareBits( Gia_Man_t * p, Vec_Wec_t * vPats )
{
    Gia_Obj_t * pObj;
    int i, k, fCompl0, fCompl1;
    word Counter = 0;
    Vec_Int_t * vPat;
    Vec_WecForEachLevel( vPats, vPat, i )
    {
        int Count = 0;
        assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );

        // propagate forward
        Gia_ManConst0(p)->fMark0 = 0;
        Gia_ManConst0(p)->fMark1 = 0;
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Vec_IntEntry(vPat, k);
            pObj->fMark1 = 0;
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            pObj->fMark1 = 0;
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            Gia_ObjFanin0(pObj)->fMark1 = 1;
        }
        // propagate backward
        Gia_ManForEachAndReverse( p, pObj, k )
        {
            if ( !pObj->fMark1 )
                continue;
            if ( pObj->fMark0 == 0 )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                assert( fCompl0 == 0 || fCompl1 == 0 );
                if ( fCompl1 == 0 )
                    Gia_ObjFanin1(pObj)->fMark1 = 1;
                else if ( fCompl0 == 0 )
                    Gia_ObjFanin0(pObj)->fMark1 = 1;
                
            }
            else
            {
                Gia_ObjFanin0(pObj)->fMark1 = 1;
                Gia_ObjFanin1(pObj)->fMark1 = 1;
            }
        }
        Gia_ManForEachAnd( p, pObj, k )
            Count += pObj->fMark1;
        Counter += Count;

        //printf( "%3d = %8d\n", i, Count );
    }
    Counter /= Vec_WecSize(vPats);
    printf( "Stats over %d patterns: Average care-nodes = %d (%6.2f %%)\n", Vec_WecSize(vPats), (int)Counter, 100.0*(int)Counter/Gia_ManAndNum(p) );
}